

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void P_FireWeaponAlt(player_t *player,FState *state)

{
  AWeapon *this;
  bool bVar1;
  int iVar2;
  FState *pFVar3;
  undefined4 extraout_var;
  byte local_25;
  FName local_24;
  AWeapon *local_20;
  AWeapon *weapon;
  FState *state_local;
  player_t *player_local;
  
  weapon = (AWeapon *)state;
  state_local = (FState *)player;
  bVar1 = TObjPtr<DBot>::operator==(&player->Bot,(DBot *)0x0);
  if ((!bVar1) || (bVar1 = FBoolCVar::operator_cast_to_bool(&bot_observer), !bVar1)) {
    this = (AWeapon *)state_local[5].ActionFunc;
    local_25 = 1;
    local_20 = this;
    if (this != (AWeapon *)0x0) {
      FName::FName(&local_24,NAME_AltFire);
      pFVar3 = AActor::FindState((AActor *)this,&local_24);
      local_25 = 1;
      if (pFVar3 != (FState *)0x0) {
        bVar1 = AWeapon::CheckAmmo(local_20,1,true,false,-1);
        local_25 = bVar1 ^ 0xff;
      }
    }
    if ((local_25 & 1) == 0) {
      APlayerPawn::PlayAttacking((APlayerPawn *)state_local->NextState);
      local_20->bAltFire = true;
      if (weapon == (AWeapon *)0x0) {
        iVar2 = (*(local_20->super_AInventory).super_AActor.super_DThinker.super_DObject.
                  _vptr_DObject[0x48])(local_20,*(short *)&state_local[6].NextState != 0);
        weapon = (AWeapon *)CONCAT44(extraout_var,iVar2);
      }
      P_SetPsprite((player_t *)state_local,PSP_WEAPON,(FState *)weapon,false);
      if ((*(uint *)&(local_20->super_AInventory).field_0x4dc & 0x10) == 0) {
        P_NoiseAlert((AActor *)state_local->NextState,(AActor *)state_local->NextState,false,0.0);
      }
    }
  }
  return;
}

Assistant:

void P_FireWeaponAlt (player_t *player, FState *state)
{
	AWeapon *weapon;

	// [SO] 9/2/02: People were able to do an awful lot of damage
	// when they were observers...
	if (player->Bot == nullptr && bot_observer)
	{
		return;
	}

	weapon = player->ReadyWeapon;
	if (weapon == nullptr || weapon->FindState(NAME_AltFire) == nullptr || !weapon->CheckAmmo (AWeapon::AltFire, true))
	{
		return;
	}

	player->mo->PlayAttacking ();
	weapon->bAltFire = true;

	if (state == nullptr)
	{
		state = weapon->GetAltAtkState(!!player->refire);
	}

	P_SetPsprite(player, PSP_WEAPON, state);
	if (!(weapon->WeaponFlags & WIF_NOALERT))
	{
		P_NoiseAlert (player->mo, player->mo, false);
	}
}